

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O0

void __thiscall
ot::commissioner::TokenManager::SendTokenRequest(TokenManager *this,Handler<ByteArray> *aHandler)

{
  bool bVar1;
  Error *pEVar2;
  Error local_218;
  ErrorCode local_1ec;
  ResponseHandler local_1e8;
  ErrorCode local_1c4;
  Error local_1c0;
  ErrorCode local_194;
  Error local_190;
  ErrorCode local_168;
  allocator local_161;
  string local_160;
  Error local_140;
  undefined1 local_118 [8];
  anon_class_40_2_1bbb15e4 onResponse;
  undefined1 local_e0 [8];
  Request request;
  ByteArray tokenRequest;
  Error error;
  Handler<ByteArray> *aHandler_local;
  TokenManager *this_local;
  
  Error::Error((Error *)&tokenRequest.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&request.mEndpoint);
  coap::Message::Message((Message *)local_e0,kConfirmable,kPost);
  local_118 = (undefined1  [8])this;
  std::
  function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
  ::function((function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
              *)&onResponse,aHandler);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"/.well-known/ccm",&local_161);
  coap::Message::SetUriPath(&local_140,(Message *)local_e0,&local_160);
  pEVar2 = Error::operator=((Error *)&tokenRequest.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_140)
  ;
  local_168 = kNone;
  bVar1 = commissioner::operator!=(pEVar2,&local_168);
  Error::~Error(&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  if (!bVar1) {
    coap::Message::SetContentFormat(&local_190,(Message *)local_e0,kCWT);
    pEVar2 = Error::operator=((Error *)&tokenRequest.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              &local_190);
    local_194 = kNone;
    bVar1 = commissioner::operator!=(pEVar2,&local_194);
    Error::~Error(&local_190);
    if (!bVar1) {
      MakeTokenRequest(&local_1c0,(ByteArray *)&request.mEndpoint,&this->mPublicKey,
                       &this->mCommissionerId,&this->mDomainName);
      pEVar2 = Error::operator=((Error *)&tokenRequest.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                &local_1c0);
      local_1c4 = kNone;
      bVar1 = commissioner::operator!=(pEVar2,&local_1c4);
      Error::~Error(&local_1c0);
      if (!bVar1) {
        coap::Message::Append((Message *)local_e0,(ByteArray *)&request.mEndpoint);
        std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
        function<ot::commissioner::TokenManager::SendTokenRequest(std::function<void(std::vector<unsigned_char,std::allocator<unsigned_char>>const*,ot::commissioner::Error)>)::__0&,void>
                  ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)> *
                   )&local_1e8,(anon_class_40_2_1bbb15e4 *)local_118);
        coap::CoapSecure::SendRequest(&this->mRegistrarClient,(Request *)local_e0,&local_1e8);
        std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
        ~function(&local_1e8);
      }
    }
  }
  local_1ec = kNone;
  bVar1 = commissioner::operator!=
                    ((Error *)&tokenRequest.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1ec);
  if (bVar1) {
    Error::Error(&local_218,
                 (Error *)&tokenRequest.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
    std::
    function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
    ::operator()(aHandler,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,&local_218);
    Error::~Error(&local_218);
  }
  SendTokenRequest(std::function<void(std::vector<unsigned_char,std::allocator<unsigned_char>>const*,ot::commissioner::Error)>)
  ::$_0::~__0((__0 *)local_118);
  coap::Message::~Message((Message *)local_e0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&request.mEndpoint);
  Error::~Error((Error *)&tokenRequest.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void TokenManager::SendTokenRequest(Commissioner::Handler<ByteArray> aHandler)
{
    Error     error;
    ByteArray tokenRequest;

    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [this, aHandler](const coap::Response *aResponse, Error aError) {
        Error               error;
        coap::ContentFormat contentFormat;

        SuccessOrExit(error = aError);
        VerifyOrDie(aResponse != nullptr);

        VerifyOrExit(aResponse->GetCode() == coap::Code::kChanged,
                     error = ERROR_BAD_FORMAT("expect response code as CoAP::CHANGED, but got {}",
                                              static_cast<int>(aResponse->GetCode())));
        VerifyOrExit(aResponse->GetContentFormat(contentFormat) == ErrorCode::kNone,
                     error = ERROR_BAD_FORMAT("cannot find valid CoAP Content Format option"));
        VerifyOrExit(
            contentFormat == coap::ContentFormat::kCoseSign1,
            error = ERROR_BAD_FORMAT("CoAP Content Format requires to be application/cose; cose-type=\"cose-sign1\""));

        SuccessOrExit(error = SetToken(aResponse->GetPayload()));

    exit:
        if (error != ErrorCode::kNone)
        {
            aHandler(nullptr, error);
        }
        else
        {
            aHandler(&mSignedToken, error);
        }

        // Disconnect from the registrar.
        mRegistrarClient.Disconnect(ERROR_NONE);
    };

    SuccessOrExit(error = request.SetUriPath(uri::kComToken));
    SuccessOrExit(error = request.SetContentFormat(coap::ContentFormat::kCWT));

    SuccessOrExit(error = MakeTokenRequest(tokenRequest, mPublicKey, mCommissionerId, mDomainName));
    request.Append(tokenRequest);
    mRegistrarClient.SendRequest(request, onResponse);

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(nullptr, error);
    }
}